

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedLinearAllocator.hpp
# Opt level: O0

void __thiscall Diligent::FixedLinearAllocator::Free(FixedLinearAllocator *this)

{
  FixedLinearAllocator *this_local;
  
  if ((this->m_pDataStart != (uint8_t *)0x0) && (this->m_pAllocator != (IMemoryAllocator *)0x0)) {
    (*this->m_pAllocator->_vptr_IMemoryAllocator[1])(this->m_pAllocator,this->m_pDataStart);
  }
  Reset(this);
  return;
}

Assistant:

void Free()
    {
        if (m_pDataStart != nullptr && m_pAllocator != nullptr)
        {
            m_pAllocator->Free(m_pDataStart);
        }
        Reset();
    }